

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.c
# Opt level: O0

int vorbis_synthesis_halfrate(vorbis_info *vi,int flag)

{
  codec_setup_info *ci;
  int flag_local;
  vorbis_info *vi_local;
  
  if ((*vi->codec_setup < 0x41) && (flag != 0)) {
    vi_local._4_4_ = -1;
  }
  else {
    *(uint *)((long)vi->codec_setup + 0x1690) = (uint)(flag != 0);
    vi_local._4_4_ = 0;
  }
  return vi_local._4_4_;
}

Assistant:

int vorbis_synthesis_halfrate(vorbis_info *vi,int flag){
  /* set / clear half-sample-rate mode */
  codec_setup_info     *ci=vi->codec_setup;

  /* right now, our MDCT can't handle < 64 sample windows. */
  if(ci->blocksizes[0]<=64 && flag)return -1;
  ci->halfrate_flag=(flag?1:0);
  return 0;
}